

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

int __thiscall cmCPackArchiveGenerator::PackageComponentsAllInOne(cmCPackArchiveGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmCPackLog *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  _Base_ptr p_Var6;
  allocator local_46a;
  allocator local_469;
  string local_468;
  cmArchiveWrite archive;
  ostringstream cmCPackLog_msg_1;
  cmGeneratedFileStream gf;
  
  this_00 = &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  std::__cxx11::string::string((string *)&gf,(string *)&(this->super_cmCPackGenerator).toplevel);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf);
  std::__cxx11::string::~string((string *)&gf);
  std::__cxx11::string::string((string *)&local_468,"CPACK_PACKAGE_FILE_NAME",&local_469);
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_468);
  std::__cxx11::string::string((string *)&archive,pcVar4,&local_46a);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg_1,"/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&archive);
  iVar2 = (*(this->super_cmCPackGenerator).super_cmObject._vptr_cmObject[5])(this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg_1,(char *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::string::append
            ((string *)
             (this_00->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)&gf);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  std::__cxx11::string::~string((string *)&archive);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&gf);
  poVar5 = std::operator<<((ostream *)&gf,
                           "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
                          );
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0xec,_cmCPackLog_msg_1);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gf);
  cmGeneratedFileStream::cmGeneratedFileStream(&gf);
  iVar2 = 1;
  cmGeneratedFileStream::Open
            (&gf,(((this_00->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,false,true);
  iVar3 = (*(this->super_cmCPackGenerator).super_cmObject._vptr_cmObject[0x1c])(this,&gf);
  if (iVar3 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_1,
                             "Problem to generate Header for archive < ");
    poVar5 = std::operator<<(poVar5,(string *)
                                    (this_00->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
    poVar5 = std::operator<<(poVar5,">.");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0xed,(char *)archive.Stream);
    std::__cxx11::string::~string((string *)&archive);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
    iVar2 = 0;
  }
  else {
    cmArchiveWrite::cmArchiveWrite(&archive,(ostream *)&gf,this->Compress,&this->ArchiveFormat);
    if (archive.Error._M_string_length == 0) {
      for (p_Var6 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_left;
          (_Rb_tree_header *)p_Var6 !=
          &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        addOneComponentToArchive(this,&archive,(cmCPackComponent *)(p_Var6 + 2));
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_1,"Problem to create archive < ");
      poVar5 = std::operator<<(poVar5,(string *)
                                      (this_00->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start);
      poVar5 = std::operator<<(poVar5,">. ERROR =");
      std::__cxx11::string::string((string *)&local_468,(string *)&archive.Error);
      poVar5 = std::operator<<(poVar5,(string *)&local_468);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_468);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0xed,local_468._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
      iVar2 = 0;
    }
    cmArchiveWrite::~cmArchiveWrite(&archive);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&gf);
  return iVar2;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponentsAllInOne()
{
  // reset the package file names
  packageFileNames.clear();
  packageFileNames.push_back(std::string(toplevel));
  packageFileNames[0] += "/"
    +std::string(this->GetOption("CPACK_PACKAGE_FILE_NAME"))
    + this->GetOutputExtension();
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
      << std::endl);
  DECLARE_AND_OPEN_ARCHIVE(packageFileNames[0],archive);

  // The ALL COMPONENTS in ONE package case
  std::map<std::string, cmCPackComponent>::iterator compIt;
  for (compIt=this->Components.begin();compIt!=this->Components.end();
      ++compIt )
    {
    // Add the files of this component to the archive
    addOneComponentToArchive(archive,&(compIt->second));
    }

  // archive goes out of scope so it will finalized and closed.
  return 1;
}